

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileBlockManager::MarkBlockAsUsed(SingleFileBlockManager *this,block_id_t block_id)

{
  _Rb_tree_header *p_Var1;
  block_id_t *__v;
  int iVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<long>,_std::_Rb_tree_iterator<long>_> pVar6;
  long local_20;
  
  local_20 = block_id;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar2 == 0) {
    if (local_20 < this->max_block) {
      p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(long *)(p_Var5 + 1) < local_20]
          ) {
        if (local_20 <= *(long *)(p_Var5 + 1)) {
          p_Var4 = p_Var5;
        }
      }
      p_Var5 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var5 = p_Var4, local_20 < *(long *)(p_Var4 + 1))) {
        p_Var5 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 == p_Var1) {
        IncreaseBlockReferenceCountInternal(this,local_20);
      }
      else {
        pVar6 = ::std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                equal_range(&(this->free_list)._M_t,&local_20);
        ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        _M_erase_aux(&(this->free_list)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
        pVar6 = ::std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                equal_range(&(this->newly_freed_list)._M_t,&local_20);
        ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        _M_erase_aux(&(this->newly_freed_list)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
      }
    }
    else {
      __v = &this->max_block;
      lVar3 = *__v;
      if (lVar3 < local_20) {
        do {
          ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&this->free_list,__v);
          lVar3 = *__v + 1;
          *__v = lVar3;
        } while (lVar3 < local_20);
      }
      *__v = lVar3 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void SingleFileBlockManager::MarkBlockAsUsed(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	D_ASSERT(block_id >= 0);
	if (max_block <= block_id) {
		// the block is past the current max_block
		// in this case we need to increment  "max_block" to "block_id"
		// any blocks in the middle are added to the free list
		// i.e. if max_block = 0, and block_id = 3, we need to add blocks 1 and 2 to the free list
		while (max_block < block_id) {
			free_list.insert(max_block);
			max_block++;
		}
		max_block++;
	} else if (free_list.find(block_id) != free_list.end()) {
		// block is currently in the free list - erase
		free_list.erase(block_id);
		newly_freed_list.erase(block_id);
	} else {
		// block is already in use - increase reference count
		IncreaseBlockReferenceCountInternal(block_id);
	}
}